

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeymapper.cpp
# Opt level: O1

QList<QKeyCombination> *
QKeyMapper::possibleKeys(QList<QKeyCombination> *__return_storage_ptr__,QKeyEvent *e)

{
  char *pcVar1;
  char16_t cVar2;
  QArrayData *pQVar3;
  long lVar4;
  Data *pDVar5;
  QDebug QVar6;
  int iVar7;
  KeyboardModifiers KVar8;
  QLoggingCategory *pQVar9;
  undefined4 extraout_var;
  iterator iVar10;
  iterator iVar11;
  char16_t *pcVar12;
  storage_type *psVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QList<QKeyCombination> *__range2;
  QKeySequence keySequence;
  QString local_e0;
  QString local_c8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QKeySequence local_98;
  QDebug local_90;
  QKeySequence local_88;
  QKeyCombination local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  char *local_68;
  QArrayData *local_60;
  undefined1 local_58 [8];
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = QtPrivateLogging::lcQpaKeyMapper();
  if (((pQVar9->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_68 = pQVar9->name;
    local_80.combination = 2;
    local_7c = 0;
    uStack_74 = 0;
    local_6c = 0;
    QMessageLogger::debug();
    pDVar5 = local_c8.d.d;
    local_c8.d.d[3].super_QArrayData.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = 3;
    QVar14.m_data = (storage_type *)0x27;
    QVar14.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)pDVar5,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_c8.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01'
       ) {
      QTextStream::operator<<((QTextStream *)local_c8.d.d,' ');
    }
    local_60 = &(local_c8.d.d)->super_QArrayData;
    *(int *)&local_c8.d.d[2].super_QArrayData.alloc =
         (int)local_c8.d.d[2].super_QArrayData.alloc + 1;
    ::operator<<((Stream *)local_58,(QEvent *)&local_60);
    QDebug::~QDebug((QDebug *)local_58);
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug((QDebug *)&local_c8);
  }
  iVar7 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x18])();
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x10))
            (__return_storage_ptr__,(long *)CONCAT44(extraout_var,iVar7),e);
  if ((__return_storage_ptr__->d).size != 0) goto LAB_002efddd;
  if ((e->m_key == 0) || (e->m_key == 0x1ffffff)) {
    pQVar3 = &((e->m_text).d.d)->super_QArrayData;
    lVar4 = (e->m_text).d.size;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (lVar4 == 0) goto LAB_002efddd;
    pQVar3 = &((e->m_text).d.d)->super_QArrayData;
    pcVar12 = (e->m_text).d.ptr;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      cVar2 = *pcVar12;
      KVar8 = QKeyEvent::modifiers(e);
      local_80.combination =
           (uint)KVar8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                 super_QFlagsStorage<Qt::KeyboardModifier>.i | (uint)(ushort)cVar2;
      QtPrivate::QMovableArrayOps<QKeyCombination>::emplace<QKeyCombination>
                ((QMovableArrayOps<QKeyCombination> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_80);
      QList<QKeyCombination>::end(__return_storage_ptr__);
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
      goto LAB_002efddd;
    }
    cVar2 = *pcVar12;
    KVar8 = QKeyEvent::modifiers(e);
    local_80.combination =
         (uint)KVar8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i | (uint)(ushort)cVar2;
    QtPrivate::QMovableArrayOps<QKeyCombination>::emplace<QKeyCombination>
              ((QMovableArrayOps<QKeyCombination> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,&local_80);
  }
  else {
    KVar8 = QKeyEvent::modifiers(e);
    local_80.combination =
         (uint)KVar8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i | e->m_key;
    QtPrivate::QMovableArrayOps<QKeyCombination>::emplace<QKeyCombination>
              ((QMovableArrayOps<QKeyCombination> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,&local_80);
  }
  QList<QKeyCombination>::end(__return_storage_ptr__);
LAB_002efddd:
  pQVar9 = QtPrivateLogging::lcQpaKeyMapper();
  if (((pQVar9->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    pQVar9 = QtPrivateLogging::lcQpaKeyMapper();
    if (((pQVar9->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_68 = pQVar9->name;
      local_80.combination = 2;
      local_7c = 0;
      uStack_74 = 0;
      local_6c = 0;
      QMessageLogger::debug();
      pDVar5 = local_c8.d.d;
      QVar15.m_data = (storage_type *)0x24;
      QVar15.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar15);
      QTextStream::operator<<((QTextStream *)pDVar5,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_c8.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_c8.d.d,' ');
      }
      QDebug::~QDebug((QDebug *)&local_c8);
    }
    iVar10 = QList<QKeyCombination>::begin(__return_storage_ptr__);
    iVar11 = QList<QKeyCombination>::end(__return_storage_ptr__);
    if (iVar10.i != iVar11.i) {
      do {
        local_88.d = (QKeySequencePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QKeySequence::QKeySequence
                  (&local_88,(QKeyCombination)(iVar10.i)->combination,(QKeyCombination)0x0,
                   (QKeyCombination)0x0,(QKeyCombination)0x0);
        pQVar9 = QtPrivateLogging::lcQpaKeyMapper();
        if (((pQVar9->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_68 = pQVar9->name;
          local_80.combination = 2;
          local_6c = 0;
          local_7c = 0;
          uStack_74 = 0;
          QMessageLogger::debug();
          QVar6.stream = local_b0.stream;
          (local_b0.stream)->verbosity = 0;
          QVar16.m_data = (storage_type *)0x2;
          QVar16.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar16);
          QTextStream::operator<<(&(QVar6.stream)->ts,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((local_b0.stream)->space == true) {
            QTextStream::operator<<(&(local_b0.stream)->ts,' ');
          }
          local_a8.stream = local_b0.stream;
          (local_b0.stream)->ref = (local_b0.stream)->ref + 1;
          ::operator<<((Stream *)&local_a0,(QKeyCombination)(int)&local_a8);
          QVar6.stream = local_a0.stream;
          QVar17.m_data = (storage_type *)0x1;
          QVar17.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar17);
          QTextStream::operator<<(&(QVar6.stream)->ts,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((local_a0.stream)->space == true) {
            QTextStream::operator<<(&(local_a0.stream)->ts,' ');
          }
          local_98.d = (QKeySequencePrivate *)local_a0.stream;
          (local_a0.stream)->ref = (local_a0.stream)->ref + 1;
          ::operator<<((Stream *)&local_90,&local_98);
          QVar6.stream = local_90.stream;
          QVar18.m_data = (storage_type *)0x1;
          QVar18.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar18);
          QTextStream::operator<<(&(QVar6.stream)->ts,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((local_90.stream)->space == true) {
            QTextStream::operator<<(&(local_90.stream)->ts,' ');
          }
          QKeySequence::toString(&local_e0,&local_88,NativeText);
          QString::toUtf8_helper(&local_c8);
          QVar6.stream = local_90.stream;
          pcVar12 = local_c8.d.ptr;
          if (local_c8.d.ptr == (char16_t *)0x0) {
            pcVar12 = (char16_t *)&QByteArray::_empty;
          }
          psVar13 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = psVar13 + (long)pcVar12 + 1;
            psVar13 = psVar13 + 1;
          } while (*pcVar1 != '\0');
          QVar19.m_data = psVar13;
          QVar19.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar19);
          QTextStream::operator<<(&(QVar6.stream)->ts,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((local_90.stream)->space == true) {
            QTextStream::operator<<(&(local_90.stream)->ts,' ');
          }
          if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
            }
          }
          QDebug::~QDebug(&local_90);
          QDebug::~QDebug((QDebug *)&local_98);
          QDebug::~QDebug(&local_a0);
          QDebug::~QDebug(&local_a8);
          QDebug::~QDebug(&local_b0);
        }
        QKeySequence::~QKeySequence(&local_88);
        iVar10.i = iVar10.i + 1;
      } while (iVar10.i != iVar11.i);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QKeyCombination> QKeyMapper::possibleKeys(const QKeyEvent *e)
{
    qCDebug(lcQpaKeyMapper).verbosity(3) << "Computing possible key combinations for" << e;

    const auto *platformIntegration = QGuiApplicationPrivate::platformIntegration();
    const auto *platformKeyMapper = platformIntegration->keyMapper();
    QList<QKeyCombination> result = platformKeyMapper->possibleKeyCombinations(e);

    if (result.isEmpty()) {
        if (e->key() && (e->key() != Qt::Key_unknown))
            result << e->keyCombination();
        else if (!e->text().isEmpty())
            result << (Qt::Key(e->text().at(0).unicode()) | e->modifiers());
    }

#if QT_CONFIG(shortcut)
    if (lcQpaKeyMapper().isDebugEnabled()) {
        qCDebug(lcQpaKeyMapper) << "Resulting possible key combinations:";
        for (auto keyCombination : result) {
            auto keySequence = QKeySequence(keyCombination);
            qCDebug(lcQpaKeyMapper).verbosity(0) << "\t-"
                << keyCombination << "/" << keySequence << "/"
                << qUtf8Printable(keySequence.toString(QKeySequence::NativeText));
        }
    }
#endif

    return result;
}